

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Calculator.cpp
# Opt level: O3

double Calculator::eval(String *e,Dic<double> *vars)

{
  double *pdVar1;
  KeyVal *pKVar2;
  long lVar3;
  long lVar4;
  double dVar5;
  Calculator calc;
  Calculator local_50;
  
  Calculator(&local_50,e);
  pKVar2 = (vars->super_Map<asl::String,_double>).a._a;
  if (0 < *(int *)((long)&pKVar2[-1].key.field_2 + 8)) {
    lVar4 = 0;
    lVar3 = 0;
    do {
      dVar5 = *(double *)((long)&pKVar2->value + lVar4);
      pdVar1 = asl::Map<asl::String,_double>::operator[]
                         (&local_50._variables.super_Map<asl::String,_double>,
                          (String *)((long)&(pKVar2->key)._size + lVar4));
      *pdVar1 = dVar5;
      pKVar2 = (vars->super_Map<asl::String,_double>).a._a;
      lVar3 = lVar3 + 1;
      lVar4 = lVar4 + 0x20;
    } while (lVar3 < *(int *)((long)&pKVar2[-1].key.field_2 + 8));
  }
  dVar5 = compute(&local_50);
  asl::Array<asl::Map<asl::String,_double_(*)(double)>::KeyVal>::~Array
            ((Array<asl::Map<asl::String,_double_(*)(double)>::KeyVal> *)&local_50._natfunctions);
  asl::Array<asl::Map<asl::String,_double>::KeyVal>::~Array
            ((Array<asl::Map<asl::String,_double>::KeyVal> *)&local_50._variables);
  LOCK();
  pdVar1 = (double *)((long)local_50._operands.super_Array<double>._a + -8);
  *(int *)pdVar1 = *(int *)pdVar1 + -1;
  UNLOCK();
  if (*(int *)pdVar1 == 0) {
    free((double *)((long)local_50._operands.super_Array<double>._a + -0x10));
    local_50._operands.super_Array<double>._a = (Array<double>)(double *)0x0;
  }
  asl::Array<Calculator::Token>::~Array(&local_50._operators.super_Array<Calculator::Token>);
  asl::Array<Calculator::Token>::~Array(&local_50._output);
  asl::Array<Calculator::Token>::~Array(&local_50._input);
  return dVar5;
}

Assistant:

double Calculator::eval(const String& e, const Dic<double>& vars)
{
	Calculator calc(e);
	foreach2(String& name, double value, vars)
		calc.set(name, value);
	return calc.compute();
}